

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> * __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::operator=
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *a)

{
  int *in_RSI;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDI;
  
  std::swap<int>(&in_RDI->depth,in_RSI);
  std::swap<long>(&in_RDI->width,(long *)(in_RSI + 2));
  std::swap<long>(&in_RDI->height,(long *)(in_RSI + 4));
  std::swap<long>(&in_RDI->n,(long *)(in_RSI + 6));
  std::swap<unsigned_short*>(&in_RDI->pixel,(unsigned_short **)(in_RSI + 8));
  std::swap<unsigned_short**>(&in_RDI->row,(unsigned_short ***)(in_RSI + 10));
  std::swap<unsigned_short***>(&in_RDI->img,(unsigned_short ****)(in_RSI + 0xc));
  return in_RDI;
}

Assistant:

Image<T> &operator=(Image<T> &&a) noexcept
    {
      std::swap(depth, a.depth);
      std::swap(width, a.width);
      std::swap(height, a.height);
      std::swap(n, a.n);
      std::swap(pixel, a.pixel);
      std::swap(row, a.row);
      std::swap(img, a.img);

      return *this;
    }